

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O2

void gutil::trim(string *s)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  pointer pcVar7;
  string asStack_48 [32];
  
  pcVar7 = (s->_M_dataplus)._M_p;
  sVar3 = s->_M_string_length;
  sVar5 = 0;
  while ((sVar6 = sVar3, sVar3 != sVar5 &&
         (iVar2 = isspace((int)pcVar7[sVar5]), sVar6 = sVar5, iVar2 != 0))) {
    sVar5 = sVar5 + 1;
  }
  uVar1 = sVar3;
  if (sVar6 != 0) {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)s);
    std::__cxx11::string::operator=((string *)s,asStack_48);
    std::__cxx11::string::~string(asStack_48);
    pcVar7 = (s->_M_dataplus)._M_p;
    sVar3 = s->_M_string_length;
    uVar1 = sVar3;
  }
  do {
    uVar4 = uVar1;
    if (uVar4 == 0) break;
    iVar2 = isspace((int)pcVar7[uVar4 - 1]);
    uVar1 = uVar4 - 1;
  } while (iVar2 != 0);
  if (uVar4 < sVar3) {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)s);
    std::__cxx11::string::operator=((string *)s,asStack_48);
    std::__cxx11::string::~string(asStack_48);
  }
  return;
}

Assistant:

void gutil::trim(std::string &s)
{
  size_t pos;

  pos=0;

  while (pos < s.size() && isspace(s[pos]))
  {
    pos++;
  }

  if (pos > 0)
  {
    s=s.substr(pos);
  }

  pos=s.size();

  while (pos > 0 && isspace(s[pos-1]))
  {
    pos--;
  }

  if (pos < s.size())
  {
    s=s.substr(0, pos);
  }
}